

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsView::mouseMoveEvent(QGraphicsView *this,QMouseEvent *event)

{
  QGraphicsViewPrivate *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  LayoutDirection LVar4;
  int iVar5;
  QScrollBar *this_01;
  QScrollBar *this_02;
  int iVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  if ((this_00->dragMode == ScrollHandDrag) && ((this_00->field_0x301 & 2) != 0)) {
    this_01 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    this_02 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    auVar10 = QEventPoint::position();
    dVar7 = (double)((ulong)auVar10._8_8_ & 0x8000000000000000 | (ulong)DAT_006605c0) +
            auVar10._8_8_;
    bVar1 = 2147483647.0 < dVar7;
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    auVar11 = QEventPoint::position();
    auVar10._0_8_ =
         (double)((ulong)auVar10._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar10._0_8_;
    auVar10._8_8_ =
         (double)((ulong)auVar11._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar11._0_8_;
    auVar8 = maxpd(auVar10,_DAT_006605e0);
    dVar9 = (double)((ulong)auVar11._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar11._8_8_
    ;
    bVar2 = 2147483647.0 < dVar9;
    if (dVar9 <= -2147483648.0) {
      dVar9 = -2147483648.0;
    }
    iVar6 = (int)(double)(~-(ulong)(2147483647.0 < auVar10._0_8_) & auVar8._0_8_ |
                         -(ulong)(2147483647.0 < auVar10._0_8_) & 0x41dfffffffc00000) -
            (int)(double)(~-(ulong)(2147483647.0 < auVar10._8_8_) & auVar8._8_8_ |
                         -(ulong)(2147483647.0 < auVar10._8_8_) & 0x41dfffffffc00000);
    iVar3 = QAbstractSlider::value(&this_01->super_QAbstractSlider);
    LVar4 = QWidget::layoutDirection((QWidget *)this);
    iVar5 = -iVar6;
    if (LVar4 == RightToLeft) {
      iVar5 = iVar6;
    }
    QAbstractSlider::setValue(&this_01->super_QAbstractSlider,iVar5 + iVar3);
    iVar5 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
    QAbstractSlider::setValue
              (&this_02->super_QAbstractSlider,
               (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar9) +
               (iVar5 - (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 |
                                     ~-(ulong)bVar1 & (ulong)dVar7)));
    this_00->handScrollMotions = this_00->handScrollMotions + 1;
  }
  QGraphicsViewPrivate::mouseMoveEventHandler(this_00,event);
  return;
}

Assistant:

void QGraphicsView::mouseMoveEvent(QMouseEvent *event)
{
    Q_D(QGraphicsView);

    if (d->dragMode == QGraphicsView::ScrollHandDrag) {
        if (d->handScrolling) {
            QScrollBar *hBar = horizontalScrollBar();
            QScrollBar *vBar = verticalScrollBar();
            QPoint delta = event->position().toPoint() - d->lastMouseEvent->position().toPoint();
            hBar->setValue(hBar->value() + (isRightToLeft() ? delta.x() : -delta.x()));
            vBar->setValue(vBar->value() - delta.y());

            // Detect how much we've scrolled to disambiguate scrolling from
            // clicking.
            ++d->handScrollMotions;
        }
    }

    d->mouseMoveEventHandler(event);
}